

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O0

void MPIX_NAPinit(int n_sends,int *send_procs,int *send_indptr,int *send_indices,int n_recvs,
                 int *recv_procs,int *recv_indptr,int *global_send_indices,int *global_recv_indices,
                 MPI_Comm mpi_comm,NAPComm **nap_comm_ptr)

{
  long *plVar1;
  mapped_type *pmVar2;
  long in_RCX;
  comm_data *in_RDX;
  int *unaff_RBX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  int in_R8D;
  int *unaff_R14;
  int unaff_retaddr;
  long in_stack_00000008;
  comm_data *in_stack_00000010;
  comm_data *in_stack_00000018;
  NAPComm *in_stack_00000020;
  MPI_Comm in_stack_00000028;
  topo_data *in_stack_00000030;
  int in_stack_00000038;
  int i_1;
  int i;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> recv_global_to_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> send_global_to_local;
  int recv_idx_size;
  int send_idx_size;
  vector<int,_std::allocator<int>_> send_idx_nodes;
  vector<int,_std::allocator<int>_> recv_node_to_local;
  vector<int,_std::allocator<int>_> recv_nodes;
  vector<int,_std::allocator<int>_> recv_idx_nodes;
  vector<int,_std::allocator<int>_> send_node_to_local;
  vector<int,_std::allocator<int>_> send_nodes;
  NAPComm *nap_comm;
  topo_data *topology_info;
  int num_procs;
  int rank;
  NAPComm *this;
  MPI_Comm in_stack_fffffffffffffe18;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *send_global_to_local_00;
  topo_data *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int iVar3;
  NAPComm *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  mapped_type in_stack_fffffffffffffe4c;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffe50;
  int local_168;
  int local_164;
  undefined1 in_stack_fffffffffffffeb7;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  NAPComm *in_stack_fffffffffffffee0;
  MPI_Comm in_stack_fffffffffffffee8;
  MPI_Comm in_stack_fffffffffffffef0;
  comm_data *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int iVar4;
  undefined4 in_stack_ffffffffffffff04;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> local_f8;
  MPI_Comm in_stack_ffffffffffffff60;
  topo_data *in_stack_ffffffffffffff68;
  NAPComm *in_stack_ffffffffffffff70;
  undefined1 local_48 [4];
  undefined1 local_44 [16];
  int local_34;
  long local_30;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_34 = in_R8D;
  local_30 = in_RCX;
  MPI_Comm_rank(in_stack_00000020,local_44);
  MPI_Comm_size(in_stack_00000020,local_48);
  operator_new(0x18);
  topo_data::topo_data(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  plVar1 = (long *)operator_new(0x40);
  NAPComm::NAPComm(in_stack_fffffffffffffe40,
                   (topo_data *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15678b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15679d);
  map_procs_to_nodes(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeb7);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1567f4);
  form_local_comm(unaff_retaddr,unaff_R14,unaff_RBX,
                  (int *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),in_RSI,in_RDX,in_stack_00000010,
                  in_stack_00000018,(vector<int,_std::allocator<int>_> *)in_stack_00000020,
                  in_stack_00000028,in_stack_00000030,in_stack_00000038);
  form_global_comm((comm_data *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,(topo_data *)in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffedc);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1568bb);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1568cd);
  map_procs_to_nodes(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeb7);
  send_global_to_local_00 = &local_f8;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x156924);
  this = *(NAPComm **)(*plVar1 + 8);
  form_local_comm(unaff_retaddr,unaff_R14,unaff_RBX,
                  (int *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),in_RSI,in_RDX,in_stack_00000010,
                  in_stack_00000018,(vector<int,_std::allocator<int>_> *)in_stack_00000020,
                  in_stack_00000028,in_stack_00000030,in_stack_00000038);
  form_global_comm((comm_data *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,(topo_data *)in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffedc);
  update_global_comm(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  iVar3 = (&in_RDX->num_msgs)[in_EDI];
  iVar4 = *(int *)(in_stack_00000008 + (long)local_34 * 4);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x156a3a)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x156a47)
  ;
  for (local_164 = 0; local_164 < iVar3; local_164 = local_164 + 1) {
    in_stack_fffffffffffffe4c = *(mapped_type *)(local_30 + (long)local_164 * 4);
    in_stack_fffffffffffffe50 =
         (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                   (in_stack_fffffffffffffe50,
                    (key_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    *(mapped_type *)&(in_stack_fffffffffffffe50->_M_t)._M_impl = in_stack_fffffffffffffe4c;
  }
  for (local_168 = 0; local_168 < iVar4; local_168 = local_168 + 1) {
    iVar3 = local_168;
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](in_stack_fffffffffffffe50,
                        (key_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    *pmVar2 = iVar3;
  }
  update_indices(in_stack_00000020,send_global_to_local_00,
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)this)
  ;
  NAPComm::finalize(this);
  *(long **)in_stack_00000028 = plVar1;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x156c53)
  ;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x156c60)
  ;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000020);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000020);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000020);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000020);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000020);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000020);
  return;
}

Assistant:

static void MPIX_NAPinit(const int n_sends, const int* send_procs, const int* send_indptr,
        const int* send_indices, const int n_recvs, const int* recv_procs,
        const int* recv_indptr, const int* global_send_indices,
        const int* global_recv_indices, const MPI_Comm mpi_comm,
        NAPComm** nap_comm_ptr)
{
    // Get MPI Information
    int rank, num_procs;
    MPI_Comm_rank(mpi_comm, &rank);
    MPI_Comm_size(mpi_comm, &num_procs);

    // Create topo_data object
    topo_data* topology_info = new topo_data(mpi_comm);

    // Initialize structure
    NAPComm* nap_comm = new NAPComm(topology_info);

    // Find global send nodes
    std::vector<int> send_nodes;
    std::vector<int> send_node_to_local;
    map_procs_to_nodes(nap_comm, n_sends, send_procs, send_indptr,
            send_nodes, send_node_to_local, mpi_comm, true);

    // Form initial send local comm
    std::vector<int> recv_idx_nodes;
    form_local_comm(n_sends, send_procs, send_indptr, global_send_indices, send_node_to_local,
            nap_comm->local_S_comm->send_data, nap_comm->local_S_comm->recv_data,
            nap_comm->local_L_comm->send_data, recv_idx_nodes, mpi_comm,
            topology_info, 19483);

    // Form global send data
    form_global_comm(nap_comm->local_S_comm->recv_data, nap_comm->global_comm->send_data,
            recv_idx_nodes, mpi_comm, topology_info, 93284);

    // Find global recv nodes
    std::vector<int> recv_nodes;
    std::vector<int> recv_node_to_local;
    map_procs_to_nodes(nap_comm, n_recvs, recv_procs, recv_indptr,
            recv_nodes, recv_node_to_local, mpi_comm, false);

    // Form final recv local comm
    std::vector<int> send_idx_nodes;
    form_local_comm(n_recvs, recv_procs, recv_indptr, global_recv_indices, recv_node_to_local,
            nap_comm->local_R_comm->recv_data, nap_comm->local_R_comm->send_data,
            nap_comm->local_L_comm->recv_data, send_idx_nodes, mpi_comm,
            topology_info, 32048);

    // Form global recv data
    form_global_comm(nap_comm->local_R_comm->send_data, nap_comm->global_comm->recv_data,
            send_idx_nodes, mpi_comm, topology_info, 93284);

    // Update procs for global_comm send and recvs
    update_global_comm(nap_comm, topology_info, mpi_comm);

    // Update send and receive indices
    int send_idx_size = send_indptr[n_sends];
    int recv_idx_size = recv_indptr[n_recvs];
    std::map<int, int> send_global_to_local;
    std::map<int, int> recv_global_to_local;
    for (int i = 0; i < send_idx_size; i++)
        send_global_to_local[global_send_indices[i]] = send_indices[i];
    for (int i = 0; i < recv_idx_size; i++)
        recv_global_to_local[global_recv_indices[i]] = i;
    update_indices(nap_comm, send_global_to_local, recv_global_to_local);


    // Initialize final variable (MPI_Request arrays, etc.)
    nap_comm->finalize();

    // Copy to pointer for return
    *nap_comm_ptr = nap_comm;
}